

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

char * zt_cstr_catv(char *s,...)

{
  char in_AL;
  uint uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 in_RCX;
  int *piVar9;
  undefined8 in_RDX;
  size_t sVar10;
  int *piVar11;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  int local_e8 [2];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  piVar9 = (int *)&stack0x00000008;
  uVar13 = 8;
  lVar5 = 0;
  pcVar15 = s;
  while (pcVar15 != (char *)0x0) {
    if (uVar13 < 0x29) {
      uVar1 = uVar13 + 8;
      iVar14 = *(int *)((long)local_e8 + (ulong)uVar13);
      lVar12 = (long)iVar14;
      if (0x20 < uVar13) goto LAB_00104c27;
      uVar7 = (ulong)uVar1;
      uVar1 = uVar13 + 0x10;
      piVar11 = piVar9;
      piVar9 = (int *)((long)local_e8 + uVar7);
    }
    else {
      iVar14 = *piVar9;
      lVar12 = (long)iVar14;
      piVar9 = piVar9 + 2;
      uVar1 = uVar13;
LAB_00104c27:
      piVar11 = piVar9 + 2;
    }
    sVar2 = strlen(pcVar15);
    if (sVar2 == 0) {
      lVar12 = 0;
    }
    else {
      sVar10 = 0;
      if (iVar14 < 0) {
        sVar10 = sVar2;
      }
      lVar4 = sVar10 + lVar12;
      if ((long)sVar2 <= (long)(sVar10 + lVar12)) {
        lVar4 = sVar2 - 1;
      }
      lVar12 = ((long)*piVar9 >> 0x3f & sVar2) + (long)*piVar9;
      if ((long)sVar2 <= lVar12) {
        lVar12 = sVar2 - 1;
      }
      lVar3 = lVar12;
      if (lVar12 < lVar4) {
        lVar3 = lVar4;
      }
      if (lVar4 < lVar12) {
        lVar12 = lVar4;
      }
      lVar12 = lVar12 - lVar3;
    }
    lVar4 = -lVar12;
    if (0 < lVar12) {
      lVar4 = lVar12;
    }
    if (uVar1 < 0x29) {
      piVar9 = piVar11;
      piVar11 = (int *)((long)local_e8 + (ulong)uVar1);
      uVar13 = uVar1 + 8;
    }
    else {
      piVar9 = piVar11 + 2;
      uVar13 = uVar1;
    }
    lVar5 = lVar4 + lVar5 + 2;
    pcVar15 = *(char **)piVar11;
  }
  pcVar6 = (char *)zt_malloc_p(lVar5 + 1);
  uVar13 = 8;
  ap[0].overflow_arg_area = &stack0x00000008;
  pcVar15 = pcVar6;
  do {
    if (s == (char *)0x0) {
      *pcVar15 = '\0';
      return pcVar6;
    }
    uVar7 = (ulong)uVar13;
    if (uVar7 < 0x29) {
      iVar14 = *(int *)((long)local_e8 + uVar7);
      lVar5 = (long)iVar14;
      uVar1 = uVar13 + 8;
      if (0x20 < uVar13) goto LAB_00104d4d;
      uVar1 = uVar13 + 0x10;
      piVar9 = (int *)((long)&local_e0 + uVar7);
    }
    else {
      iVar14 = *ap[0].overflow_arg_area;
      lVar5 = (long)iVar14;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      uVar1 = uVar13;
LAB_00104d4d:
      piVar9 = (int *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    sVar2 = strlen(s);
    if (sVar2 == 0) {
      lVar5 = 0;
      lVar12 = 0;
    }
    else {
      sVar10 = 0;
      if (iVar14 < 0) {
        sVar10 = sVar2;
      }
      lVar4 = sVar10 + lVar5;
      if ((long)sVar2 <= (long)(sVar10 + lVar5)) {
        lVar4 = sVar2 - 1;
      }
      lVar12 = ((long)*piVar9 >> 0x3f & sVar2) + (long)*piVar9;
      if ((long)sVar2 <= lVar12) {
        lVar12 = sVar2 - 1;
      }
      lVar5 = lVar12;
      if (lVar12 < lVar4) {
        lVar5 = lVar4;
      }
      if (lVar4 < lVar12) {
        lVar12 = lVar4;
      }
    }
    for (; lVar12 <= lVar5; lVar12 = lVar12 + 1) {
      *pcVar15 = s[lVar12];
      pcVar15 = pcVar15 + 1;
    }
    if ((ulong)uVar1 < 0x29) {
      puVar8 = (undefined8 *)((long)local_e8 + (ulong)uVar1);
      uVar13 = uVar1 + 8;
    }
    else {
      puVar8 = (undefined8 *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      uVar13 = uVar1;
    }
    s = (char *)*puVar8;
  } while( true );
}

Assistant:

char *
zt_cstr_catv(const char *s, ...) {
    char       * new;
    char       * p;
    const char * save = s;
    ssize_t      i;
    ssize_t      j;
    size_t       len  = 0;
    va_list      ap;

    va_start(ap, s);

    /* calculate the lentgh */
    while (s) {
        i    = va_arg(ap, int);
        j    = va_arg(ap, int);
        CONVERT(s, i, j);
        len += IDXLEN(i, j) + 1;
        s    = va_arg(ap, const char *);
    }

    va_end(ap);

    p = new = zt_malloc(char, len + 1);
    s = save;
    va_start(ap, s);

    while (s) {
        i = va_arg(ap, int);
        j = va_arg(ap, int);
        CONVERT(s, i, j);

        while (i <= j) {
            *p++ = s[i++];
        }
        s = va_arg(ap, const char *);
    }

    *p = '\0';
    return new;
}